

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O2

void av1_cdef_filter_fb(uint8_t *dst8,uint16_t *dst16,int dstride,uint16_t *in,int xdec,int ydec,
                       int (*dir) [16],int *dirinit,int (*var) [16],int pli,cdef_list *dlist,
                       int cdef_count,int level,int sec_strength,int damping,int coeff_shift)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int strength;
  int iVar13;
  int iVar14;
  int iVar15;
  uint16_t *__src;
  ulong uVar16;
  cdef_filter_block_func cdef_filter_fn [4];
  
  strength = level << ((byte)coeff_shift & 0x1f);
  bVar2 = (byte)coeff_shift & 0x1f;
  iVar9 = sec_strength << bVar2;
  bVar4 = 3 - (byte)xdec;
  bVar3 = 3 - (byte)ydec;
  if ((strength == 0 && iVar9 == 0) && dirinit != (int *)0x0) {
    uVar10 = 0 << bVar2;
    uVar12 = (ulong)uVar10;
    uVar6 = 1 << (bVar3 & 0x1f);
    if (1 << (bVar3 & 0x1f) < 1) {
      uVar6 = uVar10;
    }
    if (cdef_count < 1) {
      cdef_count = uVar10;
    }
    for (; uVar12 != (uint)cdef_count; uVar12 = uVar12 + 1) {
      __src = in + (long)(int)((uint)dlist[uVar12].bx << (bVar4 & 0x1f)) +
                   (long)(int)((uint)dlist[uVar12].by << (bVar3 & 0x1f)) * 0x90;
      for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
        memcpy(dst16 + (((int)uVar16 << (bVar4 & 0x1f)) + ((int)uVar12 << (bVar3 + bVar4 & 0x1f))),
               __src,2L << (bVar4 & 0x3f));
        __src = __src + 0x90;
      }
    }
  }
  else {
    if (pli == 1) {
      if (xdec != ydec) {
        piVar8 = av1_cdef_filter_fb::conv422;
        if (xdec == 0) {
          piVar8 = av1_cdef_filter_fb::conv440;
        }
        uVar12 = 0;
        uVar16 = 0;
        if (0 < cdef_count) {
          uVar16 = (ulong)(uint)cdef_count;
        }
        for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
          dir[dlist[uVar12].by][dlist[uVar12].bx] = piVar8[dir[dlist[uVar12].by][dlist[uVar12].bx]];
        }
      }
    }
    else if (pli == 0) {
      if (dirinit == (int *)0x0) {
        aom_cdef_find_dir(in,dlist,var,cdef_count,coeff_shift,dir);
      }
      else if (*dirinit == 0) {
        aom_cdef_find_dir(in,dlist,var,cdef_count,coeff_shift,dir);
        *dirinit = 1;
      }
    }
    iVar5 = damping + -1 + (uint)(pli == 0) + coeff_shift;
    uVar10 = 8 >> ((byte)xdec & 0x1f);
    uVar6 = 8 >> ((byte)ydec & 0x1f);
    if (dst8 == (uint8_t *)0x0) {
      cdef_filter_fn[0] = cdef_filter_16_0;
      cdef_filter_fn[1] = cdef_filter_16_1;
      cdef_filter_fn[2] = cdef_filter_16_2;
      cdef_filter_fn[3] = cdef_filter_16_3;
      iVar7 = 1 << (bVar4 & 0x1f);
      if (dirinit == (int *)0x0) {
        iVar7 = dstride;
      }
      uVar16 = 0;
      uVar12 = (ulong)(uint)cdef_count;
      if (cdef_count < 1) {
        uVar12 = uVar16;
      }
      for (; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        bVar2 = dlist[uVar16].by;
        bVar1 = dlist[uVar16].bx;
        iVar15 = strength;
        if (pli == 0) {
          iVar15 = adjust_strength(strength,var[bVar2][bVar1]);
        }
        iVar11 = (uint)bVar1 << (bVar4 & 0x1f);
        iVar13 = (int)uVar16 << (bVar3 + bVar4 & 0x1f);
        if (dirinit == (int *)0x0) {
          iVar13 = ((uint)bVar2 << (bVar3 & 0x1f)) * dstride + iVar11;
        }
        if (strength == 0) {
          iVar14 = 0;
        }
        else {
          iVar14 = dir[bVar2][bVar1];
        }
        (**(code **)((long)cdef_filter_fn +
                    (ulong)((uint)(iVar15 == 0) * 0x10 + (uint)(iVar9 == 0) * 8)))
                  (dst16 + iVar13,iVar7,in + (int)(((uint)bVar2 * 0x90 << (bVar3 & 0x1f)) + iVar11),
                   iVar15,iVar9,iVar14,iVar5,iVar5,coeff_shift,uVar10,uVar6);
      }
    }
    else {
      cdef_filter_fn[0] = cdef_filter_8_0;
      cdef_filter_fn[1] = cdef_filter_8_1;
      cdef_filter_fn[2] = cdef_filter_8_2;
      cdef_filter_fn[3] = cdef_filter_8_3;
      uVar16 = 0;
      uVar12 = (ulong)(uint)cdef_count;
      if (cdef_count < 1) {
        uVar12 = uVar16;
      }
      for (; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        bVar2 = dlist[uVar16].by;
        bVar1 = dlist[uVar16].bx;
        iVar7 = strength;
        if (pli == 0) {
          iVar7 = adjust_strength(strength,var[bVar2][bVar1]);
        }
        iVar15 = (uint)bVar1 << (bVar4 & 0x1f);
        if (strength == 0) {
          iVar13 = 0;
        }
        else {
          iVar13 = dir[bVar2][bVar1];
        }
        (**(code **)((long)cdef_filter_fn +
                    (ulong)((uint)(iVar7 == 0) * 0x10 + (uint)(iVar9 == 0) * 8)))
                  (dst8 + (int)(((uint)bVar2 << (bVar3 & 0x1f)) * dstride + iVar15),dstride,
                   in + (int)(((uint)bVar2 * 0x90 << (bVar3 & 0x1f)) + iVar15),iVar7,iVar9,iVar13,
                   iVar5,iVar5,coeff_shift,uVar10,uVar6);
      }
    }
  }
  return;
}

Assistant:

void av1_cdef_filter_fb(uint8_t *dst8, uint16_t *dst16, int dstride,
                        const uint16_t *in, int xdec, int ydec,
                        int dir[CDEF_NBLOCKS][CDEF_NBLOCKS], int *dirinit,
                        int var[CDEF_NBLOCKS][CDEF_NBLOCKS], int pli,
                        cdef_list *dlist, int cdef_count, int level,
                        int sec_strength, int damping, int coeff_shift) {
  int bi;
  int bx;
  int by;
  const int pri_strength = level << coeff_shift;
  sec_strength <<= coeff_shift;
  damping += coeff_shift - (pli != AOM_PLANE_Y);
  const int bw_log2 = 3 - xdec;
  const int bh_log2 = 3 - ydec;
  if (dirinit && pri_strength == 0 && sec_strength == 0) {
    // If we're here, both primary and secondary strengths are 0, and
    // we still haven't written anything to y[] yet, so we just copy
    // the input to y[]. This is necessary only for av1_cdef_search()
    // and only av1_cdef_search() sets dirinit.
    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      // TODO(stemidts/jmvalin): SIMD optimisations
      for (int iy = 0; iy < 1 << bh_log2; iy++) {
        memcpy(&dst16[(bi << (bw_log2 + bh_log2)) + (iy << bw_log2)],
               &in[((by << bh_log2) + iy) * CDEF_BSTRIDE + (bx << bw_log2)],
               ((size_t)1 << bw_log2) * sizeof(*dst16));
      }
    }
    return;
  }

  if (pli == 0) {
    if (!dirinit || !*dirinit) {
      aom_cdef_find_dir(in, dlist, var, cdef_count, coeff_shift, dir);
      if (dirinit) *dirinit = 1;
    }
  }
  if (pli == 1 && xdec != ydec) {
    for (bi = 0; bi < cdef_count; bi++) {
      static const int conv422[8] = { 7, 0, 2, 4, 5, 6, 6, 6 };
      static const int conv440[8] = { 1, 2, 2, 2, 3, 4, 6, 0 };
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      dir[by][bx] = (xdec ? conv422 : conv440)[dir[by][bx]];
    }
  }

  if (dst8) {
    const int block_width = 8 >> xdec;
    const int block_height = 8 >> ydec;
    /*
     * strength_index == 0 : enable_primary = 1, enable_secondary = 1
     * strength_index == 1 : enable_primary = 1, enable_secondary = 0
     * strength_index == 2 : enable_primary = 0, enable_secondary = 1
     * strength_index == 3 : enable_primary = 0, enable_secondary = 0
     */
    const cdef_filter_block_func cdef_filter_fn[4] = {
      cdef_filter_8_0, cdef_filter_8_1, cdef_filter_8_2, cdef_filter_8_3
    };

    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      const int t =
          (pli ? pri_strength : adjust_strength(pri_strength, var[by][bx]));
      const int strength_index = (sec_strength == 0) | ((t == 0) << 1);

      cdef_filter_fn[strength_index](
          &dst8[(by << bh_log2) * dstride + (bx << bw_log2)], dstride,
          &in[(by * CDEF_BSTRIDE << bh_log2) + (bx << bw_log2)], t,
          sec_strength, pri_strength ? dir[by][bx] : 0, damping, damping,
          coeff_shift, block_width, block_height);
    }
  } else {
    const int block_width = 8 >> xdec;
    const int block_height = 8 >> ydec;
    /*
     * strength_index == 0 : enable_primary = 1, enable_secondary = 1
     * strength_index == 1 : enable_primary = 1, enable_secondary = 0
     * strength_index == 2 : enable_primary = 0, enable_secondary = 1
     * strength_index == 3 : enable_primary = 0, enable_secondary = 0
     */
    const cdef_filter_block_func cdef_filter_fn[4] = {
      cdef_filter_16_0, cdef_filter_16_1, cdef_filter_16_2, cdef_filter_16_3
    };

    for (bi = 0; bi < cdef_count; bi++) {
      by = dlist[bi].by;
      bx = dlist[bi].bx;
      const int t =
          (pli ? pri_strength : adjust_strength(pri_strength, var[by][bx]));
      const int strength_index = (sec_strength == 0) | ((t == 0) << 1);

      cdef_filter_fn[strength_index](
          &dst16[dirinit ? bi << (bw_log2 + bh_log2)
                         : (by << bh_log2) * dstride + (bx << bw_log2)],
          dirinit ? 1 << bw_log2 : dstride,
          &in[(by * CDEF_BSTRIDE << bh_log2) + (bx << bw_log2)], t,
          sec_strength, pri_strength ? dir[by][bx] : 0, damping, damping,
          coeff_shift, block_width, block_height);
    }
  }
}